

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O2

void prepare_vertical_filter_coeffs(int gamma,int sy,__m128i *coeffs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  int iVar17;
  
  iVar17 = sy >> 10;
  uVar1 = *(undefined4 *)(av1_warped_filter[iVar17] + 2);
  uVar2 = *(undefined4 *)(av1_warped_filter[iVar17] + 4);
  uVar3 = *(undefined4 *)(av1_warped_filter[iVar17] + 6);
  iVar16 = sy + gamma * 2 >> 10;
  uVar4 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar5 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar6 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar7 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  iVar16 = sy + gamma * 4 >> 10;
  uVar8 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar9 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar10 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar11 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  iVar16 = gamma * 6 + sy >> 10;
  uVar12 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar13 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar14 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar15 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  *(undefined4 *)*coeffs = *(undefined4 *)av1_warped_filter[iVar17];
  *(undefined4 *)((long)*coeffs + 4) = uVar4;
  *(undefined4 *)(*coeffs + 1) = uVar8;
  *(undefined4 *)((long)*coeffs + 0xc) = uVar12;
  *(undefined4 *)coeffs[1] = uVar1;
  *(undefined4 *)((long)coeffs[1] + 4) = uVar5;
  *(undefined4 *)(coeffs[1] + 1) = uVar9;
  *(undefined4 *)((long)coeffs[1] + 0xc) = uVar13;
  *(undefined4 *)coeffs[2] = uVar2;
  *(undefined4 *)((long)coeffs[2] + 4) = uVar6;
  *(undefined4 *)(coeffs[2] + 1) = uVar10;
  *(undefined4 *)((long)coeffs[2] + 0xc) = uVar14;
  *(undefined4 *)coeffs[3] = uVar3;
  *(undefined4 *)((long)coeffs[3] + 4) = uVar7;
  *(undefined4 *)(coeffs[3] + 1) = uVar11;
  *(undefined4 *)((long)coeffs[3] + 0xc) = uVar15;
  iVar17 = sy + gamma >> 10;
  uVar1 = *(undefined4 *)(av1_warped_filter[iVar17] + 2);
  uVar2 = *(undefined4 *)(av1_warped_filter[iVar17] + 4);
  uVar3 = *(undefined4 *)(av1_warped_filter[iVar17] + 6);
  iVar16 = gamma * 3 + sy >> 10;
  uVar4 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar5 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar6 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar7 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  iVar16 = gamma * 5 + sy >> 10;
  uVar8 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar9 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar10 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar11 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  iVar16 = gamma * 7 + sy >> 10;
  uVar12 = *(undefined4 *)av1_warped_filter[iVar16];
  uVar13 = *(undefined4 *)(av1_warped_filter[iVar16] + 2);
  uVar14 = *(undefined4 *)(av1_warped_filter[iVar16] + 4);
  uVar15 = *(undefined4 *)(av1_warped_filter[iVar16] + 6);
  *(undefined4 *)coeffs[4] = *(undefined4 *)av1_warped_filter[iVar17];
  *(undefined4 *)((long)coeffs[4] + 4) = uVar4;
  *(undefined4 *)(coeffs[4] + 1) = uVar8;
  *(undefined4 *)((long)coeffs[4] + 0xc) = uVar12;
  *(undefined4 *)coeffs[5] = uVar1;
  *(undefined4 *)((long)coeffs[5] + 4) = uVar5;
  *(undefined4 *)(coeffs[5] + 1) = uVar9;
  *(undefined4 *)((long)coeffs[5] + 0xc) = uVar13;
  *(undefined4 *)coeffs[6] = uVar2;
  *(undefined4 *)((long)coeffs[6] + 4) = uVar6;
  *(undefined4 *)(coeffs[6] + 1) = uVar10;
  *(undefined4 *)((long)coeffs[6] + 0xc) = uVar14;
  *(undefined4 *)coeffs[7] = uVar3;
  *(undefined4 *)((long)coeffs[7] + 4) = uVar7;
  *(undefined4 *)(coeffs[7] + 1) = uVar11;
  *(undefined4 *)((long)coeffs[7] + 0xc) = uVar15;
  return;
}

Assistant:

static inline void prepare_vertical_filter_coeffs(int gamma, int sy,
                                                  __m128i *coeffs) {
  const __m128i tmp_0 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 0 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_2 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 2 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_4 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 4 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_6 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 6 * gamma) >> WARPEDDIFF_PREC_BITS)));

  const __m128i tmp_8 = _mm_unpacklo_epi32(tmp_0, tmp_2);
  const __m128i tmp_10 = _mm_unpacklo_epi32(tmp_4, tmp_6);
  const __m128i tmp_12 = _mm_unpackhi_epi32(tmp_0, tmp_2);
  const __m128i tmp_14 = _mm_unpackhi_epi32(tmp_4, tmp_6);

  // even coeffs
  coeffs[0] = _mm_unpacklo_epi64(tmp_8, tmp_10);
  coeffs[1] = _mm_unpackhi_epi64(tmp_8, tmp_10);
  coeffs[2] = _mm_unpacklo_epi64(tmp_12, tmp_14);
  coeffs[3] = _mm_unpackhi_epi64(tmp_12, tmp_14);

  const __m128i tmp_1 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 1 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_3 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 3 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_5 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 5 * gamma) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_7 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 7 * gamma) >> WARPEDDIFF_PREC_BITS)));

  const __m128i tmp_9 = _mm_unpacklo_epi32(tmp_1, tmp_3);
  const __m128i tmp_11 = _mm_unpacklo_epi32(tmp_5, tmp_7);
  const __m128i tmp_13 = _mm_unpackhi_epi32(tmp_1, tmp_3);
  const __m128i tmp_15 = _mm_unpackhi_epi32(tmp_5, tmp_7);

  // odd coeffs
  coeffs[4] = _mm_unpacklo_epi64(tmp_9, tmp_11);
  coeffs[5] = _mm_unpackhi_epi64(tmp_9, tmp_11);
  coeffs[6] = _mm_unpacklo_epi64(tmp_13, tmp_15);
  coeffs[7] = _mm_unpackhi_epi64(tmp_13, tmp_15);
}